

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare_test.c
# Opt level: O0

int version_test(char *v1,char *v2,int flags1,int flags2,int expected)

{
  FILE *__stream;
  char cVar1;
  char cVar2;
  int local_30;
  int result;
  int expected_local;
  int flags2_local;
  int flags1_local;
  char *v2_local;
  char *v1_local;
  
  if ((flags1 == 0) && (flags2 == 0)) {
    local_30 = version_compare2(v1,v2);
  }
  else {
    local_30 = version_compare4(v1,v2,flags1,flags2);
  }
  __stream = _stderr;
  if (local_30 != expected) {
    cVar1 = comparison_to_char(expected);
    cVar2 = comparison_to_char(local_30);
    fprintf(__stream,"[FAIL] \"%s\" (0x%x) %c \"%s\" (0x%x): got %c\n",v1,(ulong)(uint)flags1,
            (ulong)(uint)(int)cVar1,v2,flags2,(int)cVar2);
  }
  else {
    cVar1 = comparison_to_char(expected);
    fprintf(__stream,"[ OK ] \"%s\" (0x%x) %c \"%s\" (0x%x)\n",v1,(ulong)(uint)flags1,
            (ulong)(uint)(int)cVar1,v2,flags2);
  }
  v1_local._4_4_ = (uint)(local_30 != expected);
  return v1_local._4_4_;
}

Assistant:

static int version_test(const char* v1, const char* v2, int flags1, int flags2, int expected) {
	int result;

	if (flags1 == 0 && flags2 == 0) {
		result = version_compare2(v1, v2);
	} else {
		result = version_compare4(v1, v2, flags1, flags2);
	}

	if (result == expected) {
		fprintf(stderr, "[ OK ] \"%s\" (0x%x) %c \"%s\" (0x%x)\n", v1, flags1, comparison_to_char(expected), v2, flags2);
		return 0;
	} else {
		fprintf(stderr, "[FAIL] \"%s\" (0x%x) %c \"%s\" (0x%x): got %c\n", v1, flags1, comparison_to_char(expected), v2, flags2, comparison_to_char(result));
		return 1;
	}
}